

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

int voc_lookup_type(voccxdef *ctx,char *p,int len,int of_is_spec)

{
  char cVar1;
  byte bVar2;
  vocdef *pvVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ushort **ppuVar8;
  uint *puVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  ulong extraout_RDX;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  
  cVar1 = *p;
  lVar11 = (long)cVar1;
  if (-1 < lVar11) {
    ppuVar8 = __ctype_b_loc();
    uVar12 = 0x20;
    iVar7 = extraout_EDX;
    if ((*(byte *)((long)*ppuVar8 + lVar11 * 2 + 1) & 1) != 0) goto LAB_001f5f5f;
  }
  if ((((cVar1 < '\0') || (ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[lVar11] >> 10 & 1) != 0)) ||
      (cVar1 == '-')) || (uVar12 = 0x20, iVar7 = extraout_EDX_00, cVar1 == '\'')) {
    uVar4 = vochsh((uchar *)p,len);
    uVar12 = 0;
    iVar7 = extraout_EDX_01;
    for (pvVar3 = ctx->voccxhsh[uVar4]; pvVar3 != (vocdef *)0x0; pvVar3 = pvVar3->vocnxt) {
      bVar2 = pvVar3->voclen;
      iVar5 = voceq((uchar *)p,len,pvVar3->voctxt,(uint)bVar2);
      iVar7 = (int)extraout_RDX;
      if (iVar5 != 0) {
        uVar6 = pvVar3->vocwlst;
        uVar10 = extraout_RDX;
        while( true ) {
          if (uVar6 == 0xffffffff) {
            puVar9 = (uint *)0x0;
          }
          else {
            uVar10 = (ulong)((uVar6 / 2000) * 2000);
            puVar9 = (uint *)((long)&ctx->voccxwp[(ulong)uVar6 / 2000]->vocwnxt +
                             (ulong)((uVar6 % 2000) * 8));
          }
          iVar7 = (int)uVar10;
          if (puVar9 == (uint *)0x0) break;
          if ((*(byte *)((long)puVar9 + 7) & 8) == 0) {
            if ((ulong)*(byte *)((long)puVar9 + 6) == 7) {
              if ((uint)bVar2 == len) {
                uVar12 = uVar12 | 0x44;
              }
            }
            else {
              uVar12 = uVar12 | voctype[*(byte *)((long)puVar9 + 6)];
            }
          }
          uVar6 = *puVar9;
        }
      }
    }
  }
LAB_001f5f5f:
  if ((of_is_spec != 0) && (uVar12 == 0)) {
    iVar7 = voc_check_special(ctx,p,iVar7);
    uVar12 = (uint)(iVar7 != 0) << 5;
  }
  return uVar12;
}

Assistant:

static int voc_lookup_type(voccxdef *ctx, char *p, int len, int of_is_spec)
{
    int t;
    
    /* check for a special word */
    if (vocisspec(p))
    {
        /* it's a special word - this is its type */
        t = VOCT_SPEC;
    }
    else
    {
        vocwdef *vw;
        vocdef  *v;

        /*
         *   Now check the various entries of this word to get the word
         *   type flag bits.  The Noun and Adjective flags can be set for
         *   any word which matches this word in the first six letters (or
         *   more if more were provided by the player), but the Plural
         *   flag can only be set if the plural word matches exactly.
         *   Note that this pass only matches the first word in two-word
         *   verbs; the second word is considered later during the
         *   semantic analysis.  
         */
        for (t = 0, v = ctx->voccxhsh[vochsh((uchar *)p, len)] ; v != 0 ;
             v = v->vocnxt)
        {
            /* if this hash chain entry matches, add it to our types */
            if (voceq((uchar *)p, len, v->voctxt, v->voclen))
            {
                /* we have a match - look through relation list for word */
                for (vw = vocwget(ctx, v->vocwlst) ; vw != 0 ;
                     vw = vocwget(ctx, vw->vocwnxt))
                {
                    /* skip this word if it's been deleted */
                    if (vw->vocwflg & VOCFDEL)
                        continue;

                    /* we need a special check for plurals */
                    if (vw->vocwtyp == PRP_PLURAL)
                    {
                        /* plurals must be exact (non-truncated) match */
                        if (len == v->voclen)
                        {
                            /* plurals also count as nouns */
                            t |= (VOCT_NOUN | VOCT_PLURAL);
                        }
                    }
                    else
                    {
                        /* add this type bit to our type value */
                        t |= voctype[vw->vocwtyp];
                    }
                }
            }
        }
    }

    /* check for "of" if the caller wants us to */
    if (of_is_spec && t == 0 && voc_check_special(ctx, p, VOCW_OF))
        t = VOCT_SPEC;

    /* return the type */
    return t;
}